

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexDualAreas
          (IntrinsicGeometryInterface *this)

{
  bool bVar1;
  double *pdVar2;
  SurfaceMesh *in_RDI;
  Vertex v;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator> *__range3;
  double A;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  MeshData<geometrycentral::surface::Vertex,_double> *in_stack_fffffffffffffeb8;
  MeshData<geometrycentral::surface::Face,_double> *in_stack_fffffffffffffed0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
  in_stack_fffffffffffffed8;
  ParentMeshT *in_stack_fffffffffffffee8;
  MeshData<geometrycentral::surface::Vertex,_double> *in_stack_fffffffffffffef0;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator> local_e8;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator> *local_c0;
  ParentMeshT *local_b8;
  size_t local_b0;
  double local_a8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_a0;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_RDI);
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (double)in_stack_fffffffffffffed8.ind);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=
            ((MeshData<geometrycentral::surface::Vertex,_double> *)in_RDI,in_stack_fffffffffffffeb8)
  ;
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Vertex,_double> *)in_RDI);
  SurfaceMesh::faces(in_RDI);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_RDI);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_RDI);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_RDI,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    local_a0 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x242973);
    local_b8 = local_a0.mesh;
    local_b0 = local_a0.ind;
    pdVar2 = MeshData<geometrycentral::surface::Face,_double>::operator[]
                       (in_stack_fffffffffffffed0,(Face)in_stack_fffffffffffffed8);
    local_a8 = *pdVar2;
    Face::adjacentVertices((Face *)in_stack_fffffffffffffed0);
    local_c0 = &local_e8;
    NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator> *)
               in_stack_fffffffffffffed0);
    NavigationSetBase<geometrycentral::surface::FaceAdjacentVertexNavigator>::end
              ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator> *)
               &stack0xfffffffffffffee8,local_c0);
    while( true ) {
      bVar1 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>::
              operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>
                          *)in_RDI,
                         (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>
                          *)in_stack_fffffffffffffeb8);
      if (!bVar1) break;
      in_stack_fffffffffffffed8 =
           (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
           NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>::operator*
                     ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>
                       *)0x242a33);
      in_stack_fffffffffffffeb8 =
           (MeshData<geometrycentral::surface::Vertex,_double> *)(local_a8 / 3.0);
      in_stack_fffffffffffffed0 =
           (MeshData<geometrycentral::surface::Face,_double> *)in_stack_fffffffffffffed8.ind;
      pdVar2 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Vertex,_double> *)
                          in_stack_fffffffffffffed0,(Vertex)in_stack_fffffffffffffed8);
      *pdVar2 = (double)in_stack_fffffffffffffeb8 + *pdVar2;
      NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator>::operator++
                ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentVertexNavigator> *)
                 in_RDI);
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_RDI);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexDualAreas() {
  faceAreasQ.ensureHave();

  vertexDualAreas = VertexData<double>(mesh, 0.);

  for (Face f : mesh.faces()) {
    double A = faceAreas[f];
    for (Vertex v : f.adjacentVertices()) {
      vertexDualAreas[v] += A / 3.0;
    }
  }
}